

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall Js::FunctionBody::RedeferFunction(FunctionBody *this)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  ThreadContext *pTVar4;
  SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
  *pSVar5;
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_> *pWVar6;
  code *pcVar7;
  bool bVar8;
  uint32 uVar9;
  uint uVar10;
  int iVar11;
  undefined4 *puVar12;
  void *pvVar13;
  ByteBlock *pBVar14;
  long lVar15;
  FunctionInfo *pFVar16;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ParseableFunctionInfo *pPVar17;
  char16_t *pcVar18;
  long lVar19;
  Type sourceContextId;
  
  pFVar16 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  if (pFVar16 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x561,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar8) goto LAB_0075c5cb;
    *puVar12 = 0;
    pFVar16 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((FunctionBody *)(pFVar16->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x562,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar8) goto LAB_0075c5cb;
    *puVar12 = 0;
    pFVar16 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  if ((pFVar16->attributes & CanDefer) == None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x3bc,"(this->CanBeDeferred())","this->CanBeDeferred()");
    if (!bVar8) goto LAB_0075c5cb;
    *puVar12 = 0;
    pFVar16 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    sourceContextId =
         ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
            m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
    if (pFVar16 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar8) goto LAB_0075c5cb;
      *puVar12 = 0;
      pFVar16 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
  }
  else {
    sourceContextId =
         ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
            m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
  }
  bVar8 = Phases::IsEnabled((Phases *)&DAT_015b3868,RedeferralPhase,sourceContextId,
                            pFVar16->functionId);
  if (bVar8) {
    pTVar4 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->
             threadContext;
    pTVar4->redeferredFunctions = pTVar4->redeferredFunctions + 1;
    uVar9 = GetCountField(this,InlineCacheCount);
    pTVar4->recoveredBytes = uVar9 * 0x20 + pTVar4->recoveredBytes + 0x1e8;
    pBVar14 = (this->byteCodeBlock).ptr;
    if (pBVar14 != (ByteBlock *)0x0) {
      uVar10 = ByteBlock::GetLength(pBVar14);
      pTVar4->recoveredBytes = pTVar4->recoveredBytes + uVar10;
      pvVar13 = FunctionProxy::GetAuxPtr((FunctionProxy *)this,AuxBlock);
      if (pvVar13 != (void *)0x0) {
        pBVar14 = (ByteBlock *)FunctionProxy::GetAuxPtr((FunctionProxy *)this,AuxBlock);
        uVar10 = ByteBlock::GetLength(pBVar14);
        pTVar4->recoveredBytes = pTVar4->recoveredBytes + uVar10;
      }
    }
    pSVar5 = (this->entryPoints).ptr;
    if ((pSVar5 != (SynchronizableList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_JsUtil::List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>,_Js::DefaultContainerLockPolicy,_CriticalSection>
                    *)0x0) &&
       (lVar15 = (long)(pSVar5->
                       super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                       ).
                       super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
                       .count, 0 < lVar15)) {
      pWVar6 = (pSVar5->
               super_List<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               ).
               super_ReadOnlyList<Memory::RecyclerWeakReference<Js::FunctionEntryPointInfo>_*,_Memory::Recycler,_DefaultComparer>
               .buffer.ptr;
      lVar19 = 0;
      do {
        if (((pWVar6[lVar19].ptr)->super_RecyclerWeakReferenceBase).strongRef != (Type)0x0) {
          pTVar4->recoveredBytes = pTVar4->recoveredBytes + 8;
        }
        lVar19 = lVar19 + 1;
      } while (lVar15 != lVar19);
    }
  }
  puVar1 = &(this->counters).field_0x1;
  *puVar1 = *puVar1 & 0xfe;
  pFVar16 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  uVar10 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
              m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
  if (pFVar16 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar12 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar8) goto LAB_0075c5cb;
    *puVar12 = 0;
    pFVar16 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  }
  bVar8 = Phases::IsEnabled((Phases *)&DAT_015b6718,RedeferralPhase,uVar10,pFVar16->functionId);
  if (bVar8) {
    pFVar16 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    uVar2 = ((((((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
               m_srcInfo).ptr)->sourceContextInfo).ptr)->sourceContextId;
    if (pFVar16 == (FunctionInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar12 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                  ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
      if (!bVar8) {
LAB_0075c5cb:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar12 = 0;
      pFVar16 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
    }
    uVar3 = pFVar16->functionId;
    iVar11 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
               super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
    if (CONCAT44(extraout_var,iVar11) == 0) {
      pcVar18 = L"Anonymous function)";
    }
    else {
      iVar11 = (*(this->super_ParseableFunctionInfo).super_FunctionProxy.super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])(this);
      pcVar18 = (char16_t *)CONCAT44(extraout_var_00,iVar11);
    }
    Output::Print(L"Redeferring function %d.%d: %s\n",(ulong)uVar2,(ulong)uVar3,pcVar18);
    Output::Flush();
  }
  pPVar17 = ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(this);
  pFVar16 = (this->super_ParseableFunctionInfo).super_FunctionProxy.functionInfo.ptr;
  RedeferFunctionObjectTypes(this);
  Cleanup(this,false);
  if ((this->field_0x178 & 8) != 0) {
    Utf8SourceInfo::RemoveFunctionBody
              ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr,this);
  }
  *(undefined1 *)&pFVar16->attributes = (char)pFVar16->attributes | DeferredParse;
  Memory::Recycler::WBSetBit((char *)&pFVar16->functionBodyImpl);
  (pFVar16->functionBodyImpl).ptr = &pPVar17->super_FunctionProxy;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&pFVar16->functionBodyImpl);
  FunctionInfo::SetOriginalEntryPoint(pFVar16,InterpreterStackFrame::DelayDynamicInterpreterThunk);
  return;
}

Assistant:

void FunctionBody::RedeferFunction()
    {
        Assert(this->CanBeDeferred());

#if DBG
        if (PHASE_STATS(RedeferralPhase, this))
        {
            ThreadContext * threadContext = this->GetScriptContext()->GetThreadContext();
            threadContext->redeferredFunctions++;
            threadContext->recoveredBytes += sizeof(*this) + this->GetInlineCacheCount() * sizeof(InlineCache);
            if (this->byteCodeBlock)
            {
                threadContext->recoveredBytes += this->byteCodeBlock->GetLength();
                if (this->GetAuxiliaryData())
                {
                    threadContext->recoveredBytes += this->GetAuxiliaryData()->GetLength();
                }
            }
            this->MapEntryPoints([&](int index, FunctionEntryPointInfo * info) {
                threadContext->recoveredBytes += sizeof(info);
            });

            // TODO: Get size of polymorphic caches, jitted code, etc.
        }

        // We can't get here if the function is being jitted. Jitting was either completed or not begun.
        this->UnlockCounters();
#endif

        PHASE_PRINT_TRACE(Js::RedeferralPhase, this, _u("Redeferring function %d.%d: %s\n"),
                          GetSourceContextId(), GetLocalFunctionId(),
                          GetDisplayName() ? GetDisplayName() : _u("Anonymous function)"));

        ParseableFunctionInfo * parseableFunctionInfo =
            Js::ParseableFunctionInfo::NewDeferredFunctionFromFunctionBody(this);
        FunctionInfo * functionInfo = this->GetFunctionInfo();

        this->RedeferFunctionObjectTypes();

        this->Cleanup(false);

        if (GetIsFuncRegistered())
        {
            this->GetUtf8SourceInfo()->RemoveFunctionBody(this);
        }

        // New allocation is done at this point, so update existing structures
        // Adjust functionInfo attributes, point to new proxy
        functionInfo->SetAttributes((FunctionInfo::Attributes)(functionInfo->GetAttributes() | FunctionInfo::Attributes::DeferredParse));
        functionInfo->SetFunctionProxy(parseableFunctionInfo);
        functionInfo->SetOriginalEntryPoint(DefaultEntryThunk);
    }